

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono.h
# Opt level: O3

void __thiscall
fmt::v5::internal::
chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
::on_second(chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
            *this,numeric_system ns)

{
  long lVar1;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *pbVar2;
  char *__n;
  undefined1 auVar3 [16];
  size_t sVar4;
  ulong uVar5;
  tm time;
  tm local_48;
  
  if (ns == standard) {
    lVar1 = (this->s).__r;
    auVar3 = SEXT816(lVar1) * ZEXT816(0x8888888888888889);
    write(this,(int)lVar1 + ((int)(auVar3._8_8_ >> 5) - (auVar3._12_4_ >> 0x1f)) * -0x3c,(void *)0x2
          ,0x8888888888888889);
    if ((this->ms).__r != 0) {
      pbVar2 = (this->out).container;
      sVar4 = (pbVar2->super_basic_buffer<char>).size_;
      uVar5 = sVar4 + 1;
      if ((pbVar2->super_basic_buffer<char>).capacity_ < uVar5) {
        (**(pbVar2->super_basic_buffer<char>)._vptr_basic_buffer)(pbVar2);
        sVar4 = (pbVar2->super_basic_buffer<char>).size_;
        uVar5 = sVar4 + 1;
      }
      __n = (pbVar2->super_basic_buffer<char>).ptr_;
      (pbVar2->super_basic_buffer<char>).size_ = uVar5;
      __n[sVar4] = '.';
      write(this,(int)(this->ms).__r,(void *)0x3,(size_t)__n);
      return;
    }
  }
  else {
    local_48.tm_isdst = 0;
    local_48._36_4_ = 0;
    local_48.tm_gmtoff = 0;
    local_48.tm_mon = 0;
    local_48.tm_year = 0;
    local_48.tm_wday = 0;
    local_48.tm_yday = 0;
    local_48.tm_hour = 0;
    local_48.tm_mday = 0;
    local_48.tm_zone = (char *)0x0;
    lVar1 = (this->s).__r;
    auVar3 = SEXT816(lVar1) * ZEXT816(0x8888888888888889);
    local_48.tm_min = 0;
    local_48.tm_sec = (int)lVar1 + ((int)(auVar3._8_8_ >> 5) - (auVar3._12_4_ >> 0x1f)) * -0x3c;
    format_localized(this,&local_48,"%OS");
  }
  return;
}

Assistant:

void on_second(numeric_system ns) {
    if (ns == numeric_system::standard) {
      write(second(), 2);
      if (ms != std::chrono::milliseconds(0)) {
        *out++ = '.';
        write(to_int(ms.count()), 3);
      }
      return;
    }
    auto time = tm();
    time.tm_sec = second();
    format_localized(time, "%OS");
  }